

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# plaFxch.c
# Opt level: O1

void Fxch_DivisorRemove(Fxch_Man_t *p,int Lit0,int Lit1,int Weight)

{
  uint uVar1;
  uint uVar2;
  Hash_IntMan_t *pHVar3;
  Vec_Int_t *pVVar4;
  float *pfVar5;
  Vec_Que_t *p_00;
  ulong uVar6;
  int *piVar7;
  int iVar8;
  long lVar9;
  int *piVar10;
  
  if (Lit0 == Lit1) {
    __assert_fail("Lit0 != Lit1",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/base/pla/plaFxch.c"
                  ,0x174,"void Fxch_DivisorRemove(Fxch_Man_t *, int, int, int)");
  }
  pHVar3 = p->vHash;
  pVVar4 = pHVar3->vTable;
  uVar1 = pVVar4->nSize;
  if (Lit0 < Lit1) {
    uVar6 = (ulong)(uint)(Lit1 * 0x1ec1 + Lit0 * 0x1051) % (ulong)uVar1;
    iVar8 = (int)uVar6;
    if ((iVar8 < 0) || ((int)uVar1 <= iVar8)) {
LAB_0035a6ca:
      __assert_fail("i >= 0 && i < p->nSize",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/misc/vec/vecInt.h"
                    ,0x1af,"int *Vec_IntEntryP(Vec_Int_t *, int)");
    }
    piVar7 = pVVar4->pArray + uVar6;
    while( true ) {
      iVar8 = *piVar7;
      if (iVar8 == 0) {
        piVar10 = (int *)0x0;
      }
      else {
        if (iVar8 < 0) goto LAB_0035a6ca;
        uVar1 = iVar8 * 4;
        uVar2 = pHVar3->vObjs->nSize;
        if (uVar2 == uVar1 || SBORROW4(uVar2,uVar1) != (int)(uVar2 + iVar8 * -4) < 0)
        goto LAB_0035a6ca;
        piVar10 = pHVar3->vObjs->pArray + uVar1;
      }
      if (piVar10 == (int *)0x0) goto LAB_0035a687;
      if ((*piVar10 == Lit0) && (piVar10[1] == Lit1)) break;
      piVar7 = piVar10 + 3;
    }
  }
  else {
    uVar6 = (ulong)(uint)(Lit0 * 0x1ec1 + Lit1 * 0x1051) % (ulong)uVar1;
    iVar8 = (int)uVar6;
    if ((iVar8 < 0) || ((int)uVar1 <= iVar8)) goto LAB_0035a6ca;
    piVar7 = pVVar4->pArray + uVar6;
    while( true ) {
      iVar8 = *piVar7;
      if (iVar8 == 0) {
        piVar10 = (int *)0x0;
      }
      else {
        if (iVar8 < 0) goto LAB_0035a6ca;
        uVar1 = iVar8 * 4;
        uVar2 = pHVar3->vObjs->nSize;
        if (uVar2 == uVar1 || SBORROW4(uVar2,uVar1) != (int)(uVar2 + iVar8 * -4) < 0)
        goto LAB_0035a6ca;
        piVar10 = pHVar3->vObjs->pArray + uVar1;
      }
      if (piVar10 == (int *)0x0) goto LAB_0035a687;
      if ((*piVar10 == Lit1) && (piVar10[1] == Lit0)) break;
      piVar7 = piVar10 + 3;
    }
  }
  goto LAB_0035a68f;
LAB_0035a687:
  if (iVar8 != 0) {
    __assert_fail("*pPlace == 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/misc/vec/vecHash.h"
                  ,0x9b,"int *Hash_Int2ManLookup(Hash_IntMan_t *, int, int)");
  }
LAB_0035a68f:
  iVar8 = *piVar7;
  lVar9 = (long)iVar8;
  if ((0 < lVar9) && (iVar8 < (p->vWeights).nSize)) {
    pfVar5 = (p->vWeights).pArray;
    pfVar5[lVar9] = (float)-Weight + pfVar5[lVar9];
    p_00 = p->vPrio;
    if ((iVar8 < p_00->nCap) && (-1 < p_00->pOrder[lVar9])) {
      Vec_QueUpdate(p_00,iVar8);
      return;
    }
    return;
  }
  __assert_fail("iDiv > 0 && iDiv < Vec_FltSize(&p->vWeights)",
                "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/base/pla/plaFxch.c"
                ,0x179,"void Fxch_DivisorRemove(Fxch_Man_t *, int, int, int)");
}

Assistant:

void Fxch_DivisorRemove( Fxch_Man_t * p, int Lit0, int Lit1, int Weight )
{
    int iDiv;
    assert( Lit0 != Lit1 );
    if ( Lit0 < Lit1 )
        iDiv = *Hash_Int2ManLookup( p->vHash, Lit0, Lit1 );
    else
        iDiv = *Hash_Int2ManLookup( p->vHash, Lit1, Lit0 );
    assert( iDiv > 0 && iDiv < Vec_FltSize(&p->vWeights) );
    Vec_FltAddToEntry( &p->vWeights, iDiv, -Weight );
    if ( Vec_QueIsMember(p->vPrio, iDiv) )
        Vec_QueUpdate( p->vPrio, iDiv );
}